

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O2

int check_utf8_sequences(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uchar *input;
  size_t size;
  yaml_parser_t parser;
  
  puts("checking utf-8 sequences...");
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    input = (uchar *)utf8_sequences[lVar3].test;
    if (input == (uchar *)0x0) break;
    iVar1 = utf8_sequences[lVar3].result;
    printf("\t%s:\n",utf8_sequences[lVar3].title);
    while( true ) {
      for (size = 0; (input[size] != '!' && (input[size] != '|')); size = size + 1) {
      }
      yaml_parser_initialize(&parser);
      yaml_parser_set_input_string(&parser,input,size);
      iVar2 = yaml_parser_update_buffer(&parser,size);
      if (iVar2 == iVar1) {
        printf("\t\t+ ");
      }
      else {
        printf("\t\t- ");
        uVar4 = uVar4 + 1;
      }
      if (parser.error == YAML_READER_ERROR) {
        if (parser.problem_value == -1) {
          printf("(reader error: %s at %ld)\n",parser.problem,parser.problem_offset);
        }
        else {
          printf("(reader error: %s: #%X at %ld)\n",parser.problem);
        }
      }
      else if (parser.error == YAML_NO_ERROR) {
        puts("(no error)");
      }
      if (input[size] == '!') break;
      input = input + size + 1;
      yaml_parser_delete(&parser);
    }
    putchar(10);
    lVar3 = lVar3 + 1;
  }
  printf("checking utf-8 sequences: %d fail(s)\n",(ulong)uVar4);
  return uVar4;
}

Assistant:

int check_utf8_sequences(void)
{
    yaml_parser_t parser;
    int failed = 0;
    int k;
    printf("checking utf-8 sequences...\n");
    for (k = 0; utf8_sequences[k].test; k++) {
        char *title = utf8_sequences[k].title;
        int check = utf8_sequences[k].result;
        int result;
        char *start = utf8_sequences[k].test;
        char *end = start;
        printf("\t%s:\n", title);
        while(1) {
            while (*end != '|' && *end != '!') end++;
            yaml_parser_initialize(&parser);
            yaml_parser_set_input_string(&parser, (unsigned char *)start, end-start);
            result = yaml_parser_update_buffer(&parser, end-start);
            if (result != check) {
                printf("\t\t- ");
                failed ++;
            }
            else {
                printf("\t\t+ ");
            }
            if (!parser.error) {
                printf("(no error)\n");
            }
            else if (parser.error == YAML_READER_ERROR) {
                if (parser.problem_value != -1) {
                    printf("(reader error: %s: #%X at %ld)\n",
                            parser.problem, parser.problem_value, (long)parser.problem_offset);
                }
                else {
                    printf("(reader error: %s at %ld)\n",
                            parser.problem, (long)parser.problem_offset);
                }
            }
            if (*end == '!') break;
            start = ++end;
            yaml_parser_delete(&parser);
        };
        printf("\n");
    }
    printf("checking utf-8 sequences: %d fail(s)\n", failed);
    return failed;
}